

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int read_Header(archive_read *a,_7z_header_info *h,int check_header_id)

{
  _7z_coders_info *val;
  uint64_t *puVar1;
  byte bVar2;
  uchar uVar3;
  uint uVar4;
  _7z_stream_info *si;
  size_t sVar5;
  _7z_folder *p_Var6;
  _7z_coder *p_Var7;
  uint uVar8;
  int iVar9;
  uchar *p;
  uchar *puVar10;
  byte *pbVar11;
  _7z_folder *p_Var12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  size_t rbytes;
  _7z_coder *p_Var16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  uint64_t size;
  void *local_58;
  ulong local_48;
  uchar *local_40;
  ulong local_38;
  
  si = (_7z_stream_info *)a->format->data;
  if (check_header_id != 0) {
    puVar10 = header_bytes(a,1);
    if (puVar10 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar10 != '\x01') {
      return -1;
    }
  }
  pbVar11 = header_bytes(a,1);
  if (pbVar11 == (byte *)0x0) {
    return -1;
  }
  if (*pbVar11 == 2) {
    do {
      puVar10 = header_bytes(a,1);
      if (puVar10 == (uchar *)0x0) {
        uVar8 = 1;
      }
      else if (*puVar10 == '\0') {
        uVar8 = 2;
      }
      else {
        uVar8 = parse_7zip_uint64(a,&local_48);
        uVar8 = uVar8 >> 0x1f;
      }
    } while (uVar8 == 0);
    if (uVar8 != 2) {
      return -1;
    }
    pbVar11 = header_bytes(a,1);
    if (pbVar11 == (byte *)0x0) {
      return -1;
    }
  }
  if (*pbVar11 == 4) {
    iVar9 = read_StreamsInfo(a,si);
    if (iVar9 < 0) {
      return -1;
    }
    pbVar11 = header_bytes(a,1);
    if (pbVar11 == (byte *)0x0) {
      return -1;
    }
  }
  bVar2 = *pbVar11;
  if (bVar2 == 0) {
    return (uint)bVar2;
  }
  if (bVar2 != 5) {
    return -1;
  }
  val = &si[1].ci;
  iVar9 = parse_7zip_uint64(a,&val->numFolders);
  if (iVar9 < 0) {
    return -1;
  }
  if (100000000 < val->numFolders) {
    return -1;
  }
  p_Var12 = (_7z_folder *)calloc(val->numFolders,0x58);
  si[1].ci.folders = p_Var12;
  if (p_Var12 == (_7z_folder *)0x0) {
    return -1;
  }
  uVar8 = 0;
LAB_00678546:
  pbVar11 = header_bytes(a,1);
  if (pbVar11 == (byte *)0x0) goto LAB_0067857d;
  bVar2 = *pbVar11;
  if (bVar2 == 0) {
    iVar9 = 4;
    goto LAB_0067874a;
  }
  iVar9 = parse_7zip_uint64(a,&local_48);
  uVar15 = local_48;
  if ((iVar9 < 0) || (si[1].pi.numPackStreams < local_48)) goto LAB_0067857d;
  switch(bVar2) {
  case 0xe:
    if (h->emptyStreamBools == (uchar *)0x0) {
      sVar5 = val->numFolders;
      puVar10 = (uchar *)calloc(sVar5,1);
      h->emptyStreamBools = puVar10;
      if (puVar10 != (uchar *)0x0) {
        iVar17 = read_Bools(a,puVar10,sVar5);
        iVar9 = 1;
        if (iVar17 < 0) goto LAB_0067874a;
        if (val->numFolders == 0) {
          uVar8 = 0;
        }
        else {
          uVar15 = 0;
          uVar8 = 0;
          do {
            uVar8 = (uVar8 + 1) - (uint)(h->emptyStreamBools[uVar15] == '\0');
            uVar15 = uVar15 + 1;
          } while ((uVar15 & 0xffffffff) < val->numFolders);
        }
        goto LAB_00678747;
      }
    }
    break;
  case 0xf:
    if ((int)uVar8 < 1) goto switchD_006785af_caseD_16;
    if (h->emptyFileBools == (uchar *)0x0) {
      puVar10 = (uchar *)calloc((ulong)uVar8,1);
      h->emptyFileBools = puVar10;
LAB_006786aa:
      if (puVar10 != (uchar *)0x0) {
        iVar17 = read_Bools(a,puVar10,(ulong)uVar8);
        goto LAB_006785bf;
      }
    }
    break;
  case 0x10:
    if ((int)uVar8 < 1) goto switchD_006785af_caseD_16;
    if (h->antiBools == (uchar *)0x0) {
      puVar10 = (uchar *)calloc((ulong)uVar8,1);
      h->antiBools = puVar10;
      goto LAB_006786aa;
    }
    break;
  case 0x11:
    puVar10 = header_bytes(a,1);
    iVar9 = 1;
    if ((((puVar10 == (uchar *)0x0) || (uVar15 = uVar15 - 1, (uVar15 & 1) != 0)) ||
        (uVar15 < val->numFolders << 2)) || (si[1].ss.unpack_streams != 0)) {
LAB_00678724:
      bVar20 = false;
    }
    else {
      local_58 = malloc(uVar15);
      si[1].ss.unpack_streams = (size_t)local_58;
      uVar19 = uVar15;
      if (local_58 == (void *)0x0) goto LAB_00678724;
      do {
        if (uVar19 == 0) {
          uVar19 = val->numFolders;
          if (uVar19 == 0) {
            bVar20 = true;
            goto LAB_0067893c;
          }
          p_Var16 = (_7z_coder *)si[1].ss.unpack_streams;
          uVar13 = 0;
          goto LAB_006788e6;
        }
        rbytes = 0x10000;
        if (uVar19 < 0x10000) {
          rbytes = uVar19;
        }
        puVar10 = header_bytes(a,rbytes);
        if (puVar10 != (uchar *)0x0) {
          local_40 = puVar10;
          local_38 = uVar19;
          memcpy(local_58,puVar10,rbytes);
          local_58 = (void *)((long)local_58 + rbytes);
          uVar19 = local_38 - rbytes;
          puVar10 = local_40;
        }
        bVar20 = false;
      } while (puVar10 != (uchar *)0x0);
    }
    goto LAB_00678726;
  case 0x12:
  case 0x13:
  case 0x14:
    iVar17 = read_Times(a,h,(uint)bVar2);
LAB_006785bf:
    iVar9 = 1;
    if (iVar17 < 0) goto LAB_0067874a;
    goto LAB_00678747;
  case 0x15:
    puVar10 = header_bytes(a,2);
    iVar9 = 1;
    if ((puVar10 == (uchar *)0x0) || (h->attrBools != (uchar *)0x0)) {
LAB_006786e5:
      bVar20 = false;
    }
    else {
      uVar3 = *puVar10;
      sVar5 = val->numFolders;
      puVar10 = (uchar *)calloc(sVar5,1);
      h->attrBools = puVar10;
      if (puVar10 == (uchar *)0x0) {
LAB_006788bf:
        iVar9 = 1;
        bVar20 = false;
      }
      else {
        if (uVar3 == '\0') {
          iVar17 = read_Bools(a,puVar10,sVar5);
          if (iVar17 < 0) goto LAB_006786e5;
        }
        else {
          memset(puVar10,1,sVar5);
        }
        iVar9 = 6;
        bVar20 = true;
        if (val->numFolders != 0) {
          uVar14 = 1;
          uVar15 = 0;
          do {
            if (h->attrBools[uVar15] != '\0') {
              puVar10 = header_bytes(a,4);
              if (puVar10 == (uchar *)0x0) goto LAB_006788bf;
              *(undefined4 *)((long)&p_Var12->numUnpackStreams + uVar15 * 0x58 + 4) =
                   *(undefined4 *)puVar10;
            }
            uVar15 = (ulong)uVar14;
            uVar14 = uVar14 + 1;
          } while (uVar15 < val->numFolders);
          bVar20 = true;
        }
      }
    }
    if (bVar20) goto LAB_00678747;
    goto LAB_0067874a;
  default:
    goto switchD_006785af_caseD_16;
  case 0x19:
    if (local_48 == 0) goto LAB_00678747;
switchD_006785af_caseD_16:
    puVar10 = header_bytes(a,local_48);
    iVar9 = 1;
    if (puVar10 != (uchar *)0x0) goto LAB_00678747;
    goto LAB_0067874a;
  }
LAB_0067857d:
  iVar9 = 1;
  goto LAB_0067874a;
  while( true ) {
    (&p_Var12->numCoders)[uVar13 * 0xb] = (long)p_Var7 - (long)p_Var16;
    p_Var16 = (_7z_coder *)((long)&p_Var7->codec + 2);
    uVar15 = uVar15 - 2;
    uVar13 = (ulong)((int)uVar13 + 1);
    if (uVar19 <= uVar13) break;
LAB_006788e6:
    (&p_Var12->coders)[uVar13 * 0xb] = p_Var16;
    for (p_Var7 = p_Var16;
        (1 < uVar15 &&
        (((char)p_Var7->codec != '\0' || (*(undefined1 *)((long)&p_Var7->codec + 1) != '\0'))));
        p_Var7 = (_7z_coder *)((long)&p_Var7->codec + 2)) {
      uVar15 = uVar15 - 2;
    }
    bVar20 = uVar15 >= 2;
    if (uVar15 < 2) goto LAB_00678726;
  }
LAB_0067893c:
  iVar9 = 6;
LAB_00678726:
  if (bVar20) {
LAB_00678747:
    iVar9 = 0;
  }
LAB_0067874a:
  if (iVar9 != 0) goto LAB_0067894c;
  goto LAB_00678546;
LAB_0067894c:
  if (iVar9 != 4) {
    return -1;
  }
  if (si[1].ci.numFolders == 0) {
    return 0;
  }
  p_Var6 = (si->ci).folders;
  uVar19 = 0;
  iVar9 = 0;
  iVar17 = 0;
  uVar8 = 0;
  uVar15 = 0;
  do {
    if ((h->emptyStreamBools == (uchar *)0x0) || (h->emptyStreamBools[uVar19] == '\0')) {
      *(byte *)(&p_Var12->bindPairs + uVar19 * 0xb) =
           *(byte *)(&p_Var12->bindPairs + uVar19 * 0xb) | 0x10;
    }
    puVar1 = &p_Var12->numCoders + uVar19 * 0xb;
    uVar14 = *(uint *)(&p_Var12->bindPairs + uVar19 * 0xb);
    uVar4 = *(uint *)((long)&p_Var12->numUnpackStreams + uVar19 * 0x58 + 4);
    *(uint *)(&p_Var12->numUnpackStreams + uVar19 * 0xb) = uVar4 >> 0x10;
    if ((uVar14 & 0x10) == 0) {
      if (h->emptyFileBools == (uchar *)0x0) {
        bVar20 = false;
      }
      else {
        bVar20 = h->emptyFileBools[iVar17] != '\0';
        iVar17 = iVar17 + 1;
      }
      if (uVar4 < 0x10000) {
        uVar14 = 0x41ff;
        if (bVar20) {
          uVar14 = 0x81b6;
        }
LAB_00678a54:
        *(uint *)(puVar1 + 10) = uVar14;
      }
      else if ((uVar4 & 0xf0000000) != 0x40000000 && !bVar20) {
        uVar14 = uVar4 >> 0x10 & 0xfff | 0x4000;
        goto LAB_00678a54;
      }
      if ((((puVar1[10] & 0xf000) == 0x4000) && (uVar13 = *puVar1, 1 < uVar13)) &&
         ((p_Var16 = (_7z_coder *)puVar1[1], *(char *)((long)p_Var16 + (uVar13 - 2)) != '/' ||
          (*(char *)((long)p_Var16 + (uVar13 - 1)) != '\0')))) {
        *(undefined1 *)((long)&p_Var16->codec + uVar13) = 0x2f;
        *(undefined1 *)((long)&((_7z_coder *)puVar1[1])->codec + *puVar1 + 1) = 0;
        *puVar1 = *puVar1 + 2;
      }
      *(undefined4 *)((long)puVar1 + 0x14) = 0xffffffff;
    }
    else {
      if ((si->ss).unpack_streams <= (ulong)(long)iVar9) {
        return -1;
      }
      if (uVar4 < 0x10000) {
        *(undefined4 *)(puVar1 + 10) = 0x81b6;
      }
      if ((si->ss).digestsDefined[iVar9] != '\0') {
        *(uint *)(puVar1 + 3) = uVar14 | 8;
      }
      *(int *)((long)puVar1 + 0x14) = iVar9;
      iVar9 = iVar9 + 1;
    }
    if ((*(byte *)((long)puVar1 + 0x54) & 1) != 0) {
      *(byte *)(puVar1 + 10) = (byte)puVar1[10] & 0x6d;
    }
    if (((ulong)puVar1[3] & 0x10) == 0 && uVar8 == 0) {
      *(undefined4 *)(puVar1 + 2) = 0xffffffff;
      uVar8 = 0;
    }
    else {
      if (uVar8 == 0) {
        while( true ) {
          if ((si->ci).numFolders <= uVar15) {
            return -1;
          }
          if (p_Var6[uVar15].numUnpackStreams != 0) break;
          uVar15 = (ulong)((int)uVar15 + 1);
        }
      }
      *(int *)(puVar1 + 2) = (int)uVar15;
      if (((ulong)puVar1[3] & 0x10) != 0) {
        uVar8 = uVar8 + 1;
        uVar18 = (ulong)uVar8;
        uVar13 = p_Var6[uVar15].numUnpackStreams;
        if (uVar13 <= uVar18) {
          uVar8 = 0;
        }
        uVar15 = (ulong)((uint)(uVar13 <= uVar18) + (int)uVar15);
      }
    }
    uVar19 = (ulong)((int)uVar19 + 1);
    if (val->numFolders <= uVar19) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
read_Header(struct archive_read *a, struct _7z_header_info *h,
    int check_header_id)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	struct _7z_folder *folders;
	struct _7z_stream_info *si = &(zip->si);
	struct _7zip_entry *entries;
	uint32_t folderIndex, indexInFolder;
	unsigned i;
	int eindex, empty_streams, sindex;

	if (check_header_id) {
		/*
		 * Read Header.
		 */
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		if (*p != kHeader)
			return (-1);
	}

	/*
	 * Read ArchiveProperties.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kArchiveProperties) {
		for (;;) {
			uint64_t size;
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			if (*p == 0)
				break;
			if (parse_7zip_uint64(a, &size) < 0)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 * Read MainStreamsInfo.
	 */
	if (*p == kMainStreamsInfo) {
		if (read_StreamsInfo(a, &(zip->si)) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kEnd)
		return (0);

	/*
	 * Read FilesInfo.
	 */
	if (*p != kFilesInfo)
		return (-1);

	if (parse_7zip_uint64(a, &(zip->numFiles)) < 0)
		return (-1);
	if (UMAX_ENTRY < zip->numFiles)
		return (-1);

	zip->entries = calloc((size_t)zip->numFiles, sizeof(*zip->entries));
	if (zip->entries == NULL)
		return (-1);
	entries = zip->entries;

	empty_streams = 0;
	for (;;) {
		int type;
		uint64_t size;
		size_t ll;

		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		type = *p;
		if (type == kEnd)
			break;

		if (parse_7zip_uint64(a, &size) < 0)
			return (-1);
		if (zip->header_bytes_remaining < size)
			return (-1);
		ll = (size_t)size;

		switch (type) {
		case kEmptyStream:
			if (h->emptyStreamBools != NULL)
				return (-1);
			h->emptyStreamBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->emptyStreamBools));
			if (h->emptyStreamBools == NULL)
				return (-1);
			if (read_Bools(
			    a, h->emptyStreamBools, (size_t)zip->numFiles) < 0)
				return (-1);
			empty_streams = 0;
			for (i = 0; i < zip->numFiles; i++) {
				if (h->emptyStreamBools[i])
					empty_streams++;
			}
			break;
		case kEmptyFile:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			if (h->emptyFileBools != NULL)
				return (-1);
			h->emptyFileBools = calloc(empty_streams,
			    sizeof(*h->emptyFileBools));
			if (h->emptyFileBools == NULL)
				return (-1);
			if (read_Bools(a, h->emptyFileBools, empty_streams) < 0)
				return (-1);
			break;
		case kAnti:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			if (h->antiBools != NULL)
				return (-1);
			h->antiBools = calloc(empty_streams,
			    sizeof(*h->antiBools));
			if (h->antiBools == NULL)
				return (-1);
			if (read_Bools(a, h->antiBools, empty_streams) < 0)
				return (-1);
			break;
		case kCTime:
		case kATime:
		case kMTime:
			if (read_Times(a, h, type) < 0)
				return (-1);
			break;
		case kName:
		{
			unsigned char *np;
			size_t nl, nb;

			/* Skip one byte. */
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			ll--;

			if ((ll & 1) || ll < zip->numFiles * 4)
				return (-1);

			if (zip->entry_names != NULL)
				return (-1);
			zip->entry_names = malloc(ll);
			if (zip->entry_names == NULL)
				return (-1);
			np = zip->entry_names;
			nb = ll;
			/*
			 * Copy whole file names.
			 * NOTE: This loop prevents from expanding
			 * the uncompressed buffer in order not to
			 * use extra memory resource.
			 */
			while (nb) {
				size_t b;
				if (nb > UBUFF_SIZE)
					b = UBUFF_SIZE;
				else
					b = nb;
				if ((p = header_bytes(a, b)) == NULL)
					return (-1);
				memcpy(np, p, b);
				np += b;
				nb -= b;
			}
			np = zip->entry_names;
			nl = ll;

			for (i = 0; i < zip->numFiles; i++) {
				entries[i].utf16name = np;
#if defined(_WIN32) && !defined(__CYGWIN__) && defined(_DEBUG)
				entries[i].wname = (wchar_t *)np;
#endif

				/* Find a terminator. */
				while (nl >= 2 && (np[0] || np[1])) {
					np += 2;
					nl -= 2;
				}
				if (nl < 2)
					return (-1);/* Terminator not found */
				entries[i].name_len = np - entries[i].utf16name;
				np += 2;
				nl -= 2;
			}
			break;
		}
		case kAttributes:
		{
			int allAreDefined;

			if ((p = header_bytes(a, 2)) == NULL)
				return (-1);
			allAreDefined = *p;
			if (h->attrBools != NULL)
				return (-1);
			h->attrBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->attrBools));
			if (h->attrBools == NULL)
				return (-1);
			if (allAreDefined)
				memset(h->attrBools, 1, (size_t)zip->numFiles);
			else {
				if (read_Bools(a, h->attrBools,
				      (size_t)zip->numFiles) < 0)
					return (-1);
			}
			for (i = 0; i < zip->numFiles; i++) {
				if (h->attrBools[i]) {
					if ((p = header_bytes(a, 4)) == NULL)
						return (-1);
					entries[i].attr = archive_le32dec(p);
				}
			}
			break;
		}
		case kDummy:
			if (ll == 0)
				break;
			__LA_FALLTHROUGH;
		default:
			if (header_bytes(a, ll) == NULL)
				return (-1);
			break;
		}
	}

	/*
	 * Set up entry's attributes.
	 */
	folders = si->ci.folders;
	eindex = sindex = 0;
	folderIndex = indexInFolder = 0;
	for (i = 0; i < zip->numFiles; i++) {
		if (h->emptyStreamBools == NULL || h->emptyStreamBools[i] == 0)
			entries[i].flg |= HAS_STREAM;
		/* The high 16 bits of attributes is a posix file mode. */
		entries[i].mode = entries[i].attr >> 16;
		if (entries[i].flg & HAS_STREAM) {
			if ((size_t)sindex >= si->ss.unpack_streams)
				return (-1);
			if (entries[i].mode == 0)
				entries[i].mode = AE_IFREG | 0666;
			if (si->ss.digestsDefined[sindex])
				entries[i].flg |= CRC32_IS_SET;
			entries[i].ssIndex = sindex;
			sindex++;
		} else {
			int dir;
			if (h->emptyFileBools == NULL)
				dir = 1;
			else {
				if (h->emptyFileBools[eindex])
					dir = 0;
				else
					dir = 1;
				eindex++;
			}
			if (entries[i].mode == 0) {
				if (dir)
					entries[i].mode = AE_IFDIR | 0777;
				else
					entries[i].mode = AE_IFREG | 0666;
			} else if (dir &&
			    (entries[i].mode & AE_IFMT) != AE_IFDIR) {
				entries[i].mode &= ~AE_IFMT;
				entries[i].mode |= AE_IFDIR;
			}
			if ((entries[i].mode & AE_IFMT) == AE_IFDIR &&
			    entries[i].name_len >= 2 &&
			    (entries[i].utf16name[entries[i].name_len-2] != '/' ||
			     entries[i].utf16name[entries[i].name_len-1] != 0)) {
				entries[i].utf16name[entries[i].name_len] = '/';
				entries[i].utf16name[entries[i].name_len+1] = 0;
				entries[i].name_len += 2;
			}
			entries[i].ssIndex = -1;
		}
		if (entries[i].attr & 0x01)
			entries[i].mode &= ~0222;/* Read only. */

		if ((entries[i].flg & HAS_STREAM) == 0 && indexInFolder == 0) {
			/*
			 * The entry is an empty file or a directory file,
			 * those both have no contents.
			 */
			entries[i].folderIndex = -1;
			continue;
		}
		if (indexInFolder == 0) {
			for (;;) {
				if (folderIndex >= si->ci.numFolders)
					return (-1);
				if (folders[folderIndex].numUnpackStreams)
					break;
				folderIndex++;
			}
		}
		entries[i].folderIndex = folderIndex;
		if ((entries[i].flg & HAS_STREAM) == 0)
			continue;
		indexInFolder++;
		if (indexInFolder >= folders[folderIndex].numUnpackStreams) {
			folderIndex++;
			indexInFolder = 0;
		}
	}

	return (0);
}